

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

cio_error cio_websocket_write_message_first_chunk
                    (cio_websocket *websocket,size_t frame_length,cio_write_buffer *payload,
                    _Bool last_frame,_Bool is_binary,cio_websocket_write_handler_t handler,
                    void *handler_context)

{
  anon_struct_4_7_799a2f31_for_ws_flags aVar1;
  cio_error cVar2;
  cio_websocket_frame_type cVar3;
  ushort uVar4;
  
  if (handler == (cio_websocket_write_handler_t)0x0 || websocket == (cio_websocket *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  if ((websocket->ws_private).write_message_job.wbh != (cio_write_buffer *)0x0) {
    return CIO_OPERATION_NOT_PERMITTED;
  }
  aVar1 = (websocket->ws_private).ws_flags;
  uVar4 = aVar1._0_2_;
  if (((uint)aVar1 >> 0xb & 1) == 0) {
    cVar3 = CIO_WEBSOCKET_CONTINUATION_FRAME;
    if (!last_frame) goto LAB_001012b1;
    uVar4 = uVar4 | 0x800;
    cVar3 = CIO_WEBSOCKET_CONTINUATION_FRAME;
  }
  else {
    cVar3 = is_binary + CIO_WEBSOCKET_TEXT_FRAME;
    if (last_frame) goto LAB_001012b1;
    uVar4 = uVar4 & 0xf7ff;
  }
  *(ushort *)&(websocket->ws_private).ws_flags = uVar4;
LAB_001012b1:
  (websocket->ws_private).write_message_job.wbh = payload;
  (websocket->ws_private).write_message_job.handler = handler;
  (websocket->ws_private).write_message_job.handler_context = handler_context;
  (websocket->ws_private).write_message_job.frame_type = cVar3;
  (websocket->ws_private).write_message_job.last_frame = last_frame;
  (websocket->ws_private).write_message_job.stream_handler = message_written;
  (websocket->ws_private).write_message_job.is_continuation_chunk = false;
  cVar2 = enqueue_job(websocket,&(websocket->ws_private).write_message_job,frame_length);
  return cVar2;
}

Assistant:

enum cio_error cio_websocket_write_message_first_chunk(struct cio_websocket *websocket, size_t frame_length, struct cio_write_buffer *payload, bool last_frame, bool is_binary, cio_websocket_write_handler_t handler, void *handler_context)
{

	if (cio_unlikely((websocket == NULL)) || (handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(websocket->ws_private.write_message_job.wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	enum cio_websocket_frame_type kind = CIO_WEBSOCKET_TEXT_FRAME;

	if (websocket->ws_private.ws_flags.fragmented_write == 1U) {
		if (is_binary) {
			kind = CIO_WEBSOCKET_BINARY_FRAME;
		}

		if (!last_frame) {
			websocket->ws_private.ws_flags.fragmented_write = 0;
		}
	} else {
		if (last_frame) {
			websocket->ws_private.ws_flags.fragmented_write = 1;
		}

		kind = CIO_WEBSOCKET_CONTINUATION_FRAME;
	}

	websocket->ws_private.write_message_job.wbh = payload;
	websocket->ws_private.write_message_job.handler = handler;
	websocket->ws_private.write_message_job.handler_context = handler_context;
	websocket->ws_private.write_message_job.frame_type = kind;
	websocket->ws_private.write_message_job.last_frame = last_frame;
	websocket->ws_private.write_message_job.stream_handler = message_written;
	websocket->ws_private.write_message_job.is_continuation_chunk = false;

	return enqueue_job(websocket, &websocket->ws_private.write_message_job, frame_length);
}